

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_add_handle(Curl_multi *multi,Curl_easy *data)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  char *pcVar4;
  Curl_share *pCVar5;
  long lVar6;
  CURLMcode CVar7;
  PslCache *pPVar8;
  
  CVar7 = CURLM_BAD_HANDLE;
  if ((((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) &&
      (CVar7 = CURLM_BAD_EASY_HANDLE, data != (Curl_easy *)0x0)) &&
     ((data->magic == 0xc0dedbad && (CVar7 = CURLM_ADDED_ALREADY, data->multi == (Curl_multi *)0x0))
     )) {
    bVar3 = multi->field_0x279;
    CVar7 = CURLM_RECURSIVE_API_CALL;
    if ((bVar3 & 4) == 0) {
      if ((bVar3 & 0x10) != 0) {
        if (multi->num_alive != 0) {
          return CURLM_ABORTED_BY_CALLBACK;
        }
        multi->field_0x279 = bVar3 & 0xeb;
      }
      if (data->multi_easy != (Curl_multi *)0x0) {
        curl_multi_cleanup(data->multi_easy);
        data->multi_easy = (Curl_multi *)0x0;
      }
      Curl_llist_init(&(data->state).timeoutlist,(Curl_llist_dtor)0x0);
      pcVar4 = (data->set).errorbuffer;
      if (pcVar4 != (char *)0x0) {
        *pcVar4 = '\0';
      }
      (data->state).os_errno = 0;
      data->multi = multi;
      Curl_expire(data,0,EXPIRE_RUN_NOW);
      CVar7 = Curl_update_timer(multi);
      if (CVar7 == CURLM_OK) {
        if (data->mstate != MSTATE_INIT) {
          data->mstate = MSTATE_INIT;
        }
        if (((data->dns).hostcache == (Curl_hash *)0x0) ||
           ((data->dns).hostcachetype == HCACHE_NONE)) {
          (data->dns).hostcache = &multi->hostcache;
          (data->dns).hostcachetype = HCACHE_MULTI;
        }
        pCVar5 = data->share;
        if ((pCVar5 == (Curl_share *)0x0) || ((pCVar5->specifier & 0x40) == 0)) {
          pPVar8 = &multi->psl;
        }
        else {
          pPVar8 = &pCVar5->psl;
        }
        data->psl = pPVar8;
        Curl_llist_append(&multi->process,data,&data->multi_queue);
        uVar1 = multi->num_easy;
        uVar2 = multi->num_alive;
        multi->num_easy = uVar1 + 1;
        multi->num_alive = uVar2 + 1;
        lVar6 = multi->next_easy_mid;
        multi->next_easy_mid = lVar6 + 1;
        data->mid = lVar6;
        if (lVar6 < 0) {
          multi->next_easy_mid = 0;
        }
        Curl_cpool_xfer_init(data);
        CVar7 = CURLM_OK;
      }
      else {
        data->multi = (Curl_multi *)0x0;
      }
    }
  }
  return CVar7;
}

Assistant:

CURLMcode curl_multi_add_handle(struct Curl_multi *multi,
                                struct Curl_easy *data)
{
  CURLMcode rc;
  /* First, make some basic checks that the CURLM handle is a good handle */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* Verify that we got a somewhat good easy handle too */
  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  /* Prevent users from adding same easy handle more than once and prevent
     adding to more than one multi stack */
  if(data->multi)
    return CURLM_ADDED_ALREADY;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  if(multi->dead) {
    /* a "dead" handle cannot get added transfers while any existing easy
       handles are still alive - but if there are none alive anymore, it is
       fine to start over and unmark the "deadness" of this handle */
    if(multi->num_alive)
      return CURLM_ABORTED_BY_CALLBACK;
    multi->dead = FALSE;
  }

  if(data->multi_easy) {
    /* if this easy handle was previously used for curl_easy_perform(), there
       is a private multi handle here that we can kill */
    curl_multi_cleanup(data->multi_easy);
    data->multi_easy = NULL;
  }

  /* Initialize timeout list for this handle */
  Curl_llist_init(&data->state.timeoutlist, NULL);

  /*
   * No failure allowed in this function beyond this point. No modification of
   * easy nor multi handle allowed before this except for potential multi's
   * connection pool growing which will not be undone in this function no
   * matter what.
   */
  if(data->set.errorbuffer)
    data->set.errorbuffer[0] = 0;

  data->state.os_errno = 0;

  /* make the Curl_easy refer back to this multi handle - before Curl_expire()
     is called. */
  data->multi = multi;

  /* Set the timeout for this handle to expire really soon so that it will
     be taken care of even when this handle is added in the midst of operation
     when only the curl_multi_socket() API is used. During that flow, only
     sockets that time-out or have actions will be dealt with. Since this
     handle has no action yet, we make sure it times out to get things to
     happen. */
  Curl_expire(data, 0, EXPIRE_RUN_NOW);

  rc = Curl_update_timer(multi);
  if(rc) {
    data->multi = NULL; /* not anymore */
    return rc;
  }

  /* set the easy handle */
  multistate(data, MSTATE_INIT);

  /* for multi interface connections, we share DNS cache automatically if the
     easy handle's one is currently not set. */
  if(!data->dns.hostcache ||
     (data->dns.hostcachetype == HCACHE_NONE)) {
    data->dns.hostcache = &multi->hostcache;
    data->dns.hostcachetype = HCACHE_MULTI;
  }

#ifdef USE_LIBPSL
  /* Do the same for PSL. */
  if(data->share && (data->share->specifier & (1 << CURL_LOCK_DATA_PSL)))
    data->psl = &data->share->psl;
  else
    data->psl = &multi->psl;
#endif

  /* add the easy handle to the process list */
  Curl_llist_append(&multi->process, data, &data->multi_queue);

  /* increase the node-counter */
  multi->num_easy++;

  /* increase the alive-counter */
  multi->num_alive++;

  /* the identifier inside the multi instance */
  data->mid = multi->next_easy_mid++;
  if(multi->next_easy_mid <= 0)
    multi->next_easy_mid = 0;

  Curl_cpool_xfer_init(data);
  multi_warn_debug(multi, data);

  return CURLM_OK;
}